

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O1

void Gia_ManDupFadd(Gia_Man_t *pNew,Gia_Man_t *p,Vec_Int_t *vChain,Vec_Int_t *vFadds,Vec_Int_t *vMap
                   ,Vec_Wec_t *vChains,Vec_Int_t *vMap2Chain,Vec_Int_t *vTruths)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  int pLits [3];
  
  if (vChain->nSize < 1) {
    uVar8 = 0xffffffff;
  }
  else {
    lVar14 = 0;
    do {
      uVar8 = vChain->pArray[lVar14];
      lVar11 = (long)(int)(uVar8 * 5);
      lVar13 = 0;
      do {
        if (lVar14 == 0 || lVar13 != 0) {
          if ((lVar11 < 0) || (vFadds->nSize <= lVar11)) goto LAB_005db4d2;
          iVar1 = vFadds->pArray[lVar11];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005db4b3;
          Gia_ManDupWithFaddBoxes_rec
                    (pNew,p,p->pObjs + iVar1,vFadds,vMap,vChains,vMap2Chain,vTruths);
        }
        lVar11 = lVar11 + 1;
        lVar13 = lVar13 + -1;
      } while (lVar13 != -3);
      lVar14 = lVar14 + 1;
    } while (lVar14 < vChain->nSize);
  }
  uVar10 = vChain->nSize;
  if ((int)uVar10 < 1) {
    uVar5 = 0;
LAB_005db459:
    if ((int)uVar10 < 1) {
      __assert_fail("p->nSize > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
    }
    if (uVar8 != vChain->pArray[(ulong)uVar10 - 1]) {
      __assert_fail("iFadd == Vec_IntEntryLast(vChain)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                    ,0x2d5,
                    "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    if ((-1 < (int)uVar8) && (uVar8 = uVar8 * 5 + 4, (int)uVar8 < vFadds->nSize)) {
      iVar1 = vFadds->pArray[uVar8];
      if ((-1 < (long)iVar1) && (iVar1 < p->nObjs)) {
        p->pObjs[iVar1].Value = uVar5;
        return;
      }
LAB_005db4b3:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                    ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
  }
  else {
    lVar14 = 0;
    uVar5 = 0;
    while( true ) {
      uVar8 = vChain->pArray[lVar14];
      if ((int)uVar8 < 0) break;
      uVar10 = uVar8 * 2;
      if ((vTruths->nSize <= (int)uVar10) || (vTruths->nSize <= (int)(uVar10 | 1))) break;
      uVar12 = vTruths->pArray[uVar10];
      uVar10 = vTruths->pArray[uVar10 | 1];
      iVar1 = vFadds->nSize;
      lVar11 = 0;
      do {
        if (iVar1 <= (int)((int)lVar11 + uVar8 * 5)) goto LAB_005db4d2;
        iVar2 = vFadds->pArray[(ulong)uVar8 * 5 + lVar11];
        if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) goto LAB_005db4b3;
        if ((lVar11 != 0) || (uVar9 = uVar5, uVar5 == 0)) {
          uVar9 = p->pObjs[iVar2].Value;
        }
        pLits[lVar11] = uVar9;
        if ((int)uVar9 < 0) {
          __assert_fail("pLits[k] >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                        ,0x2ae,
                        "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      if ((int)uVar10 < 0xb2) {
        if (uVar10 == 0x2b) {
          if (pLits[1] < 0) goto LAB_005db510;
          pLits[1] = pLits[1] ^ 1;
        }
        else {
          if (uVar10 != 0x4d) goto LAB_005db160;
          if (pLits[0] < 0) goto LAB_005db510;
          pLits[0] = pLits[0] ^ 1;
        }
        uVar12 = ~uVar12 & 0xff;
        uVar10 = 0x8e;
      }
      else {
        if (uVar10 == 0xb2) {
          if (pLits[1] < 0) goto LAB_005db510;
          pLits[1] = pLits[1] ^ 1;
        }
        else {
          if (uVar10 != 0xd4) goto LAB_005db160;
          if (pLits[0] < 0) goto LAB_005db510;
          pLits[0] = pLits[0] ^ 1;
        }
        uVar12 = ~uVar12 & 0xff;
        uVar10 = 0xe8;
      }
LAB_005db160:
      if ((int)uVar10 < 0x8e) {
        if (uVar10 != 0x17) {
          if (uVar10 != 0x71) {
LAB_005db5e9:
            __assert_fail("iMajTruth == 0xE8 || iMajTruth == 0x17",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                          ,0x2bf,
                          "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                         );
          }
          uVar10 = 0x17;
LAB_005db1a5:
          if (pLits[2] < 0) {
LAB_005db510:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf4,"int Abc_LitNot(int)");
          }
          pLits[2] = pLits[2] ^ 1;
          uVar12 = ~uVar12 & 0xff;
        }
      }
      else if (uVar10 != 0xe8) {
        if (uVar10 != 0x8e) goto LAB_005db5e9;
        uVar10 = 0xe8;
        goto LAB_005db1a5;
      }
      if (pLits[0] < 0) {
LAB_005db54e:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf3,"int Abc_LitIsCompl(int)");
      }
      if ((pLits[0] & 1U) != 0) {
        lVar11 = 0;
        do {
          if (pLits[lVar11] < 0) goto LAB_005db510;
          pLits[lVar11] = pLits[lVar11] ^ 1;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        uVar12 = ~uVar12 & 0xff;
        uVar10 = ~uVar10 & 0xff;
      }
      if (pLits[0] < 0) goto LAB_005db54e;
      if ((pLits[0] & 1U) != 0) {
        __assert_fail("!Abc_LitIsCompl(pLits[0])",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x2c9,
                      "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      lVar11 = 0;
      do {
        Gia_ManAppendCo(pNew,pLits[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      if ((uVar12 != 0x69) && (uVar12 != 0x96)) {
        __assert_fail("iXorTruth == 0x96 || iXorTruth == 0x69",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x2cd,
                      "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (vFadds->nSize <= (int)(uVar8 * 5 + 3)) break;
      iVar1 = vFadds->pArray[(ulong)uVar8 * 5 + 3];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_005db4b3;
      pGVar3 = p->pObjs;
      pGVar6 = Gia_ManAppendObj(pNew);
      uVar4 = *(ulong *)pGVar6;
      *(ulong *)pGVar6 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar6 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar7 = pNew->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + pNew->nObjs <= pGVar6)) {
LAB_005db52f:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = pNew->pObjs;
      if ((pGVar6 < pGVar7) || (pGVar7 + pNew->nObjs <= pGVar6)) goto LAB_005db52f;
      uVar5 = (int)((ulong)((long)pGVar6 - (long)pGVar7) >> 2) * 0x55555556;
      if ((int)uVar5 < 0) {
LAB_005db56d:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf5,"int Abc_LitNotCond(int, int)");
      }
      pGVar3[iVar1].Value = uVar5 | uVar12 == 0x69;
      if ((uVar10 != 0x17) && (uVar10 != 0xe8)) {
        __assert_fail("iMajTruth == 0xE8 || iMajTruth == 0x17",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                      ,0x2d1,
                      "void Gia_ManDupFadd(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      pGVar7 = Gia_ManAppendObj(pNew);
      uVar4 = *(ulong *)pGVar7;
      *(ulong *)pGVar7 = uVar4 | 0x9fffffff;
      *(ulong *)pGVar7 =
           uVar4 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20
      ;
      pGVar3 = pNew->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + pNew->nObjs <= pGVar7)) goto LAB_005db52f;
      Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = pNew->pObjs;
      if ((pGVar7 < pGVar3) || (pGVar3 + pNew->nObjs <= pGVar7)) goto LAB_005db52f;
      uVar5 = (int)((ulong)((long)pGVar7 - (long)pGVar3) >> 2) * 0x55555556;
      if ((int)uVar5 < 0) goto LAB_005db56d;
      uVar5 = uVar5 | uVar10 == 0x17;
      lVar14 = lVar14 + 1;
      uVar10 = vChain->nSize;
      if ((int)uVar10 <= lVar14) goto LAB_005db459;
    }
  }
LAB_005db4d2:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManDupFadd( Gia_Man_t * pNew, Gia_Man_t * p, Vec_Int_t * vChain, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains, Vec_Int_t * vMap2Chain, Vec_Int_t * vTruths )
{
    extern void Gia_ManDupWithFaddBoxes_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vFadds, Vec_Int_t * vMap, Vec_Wec_t * vChains, Vec_Int_t * vMap2Chain, Vec_Int_t * vTruths );
    int i, k, iFadd = -1, iCiLit, pLits[3];
    Gia_Obj_t * pObj;
    // construct FADD inputs
    Vec_IntForEachEntry( vChain, iFadd, i )
        for ( k = 0; k < 3; k++ )
        {
            if ( i && !k ) continue;
            pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+k) );
            Gia_ManDupWithFaddBoxes_rec( pNew, p, pObj, vFadds, vMap, vChains, vMap2Chain, vTruths );
        }
    // construct boxes
    iCiLit = 0;
    Vec_IntForEachEntry( vChain, iFadd, i )
    {
        int iXorTruth = Vec_IntEntry( vTruths, 2*iFadd+0 );
        int iMajTruth = Vec_IntEntry( vTruths, 2*iFadd+1 );
        for ( k = 0; k < 3; k++ )
        {
            pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+k) );
            pLits[k] = (!k && iCiLit) ? iCiLit : pObj->Value;
            assert( pLits[k] >= 0 );
        }
        // normalize truth table
        //    if ( Truth == 0xE8 || Truth == 0xD4 || Truth == 0xB2 || Truth == 0x71 ||
        //         Truth == 0x17 || Truth == 0x2B || Truth == 0x4D || Truth == 0x8E )
        if ( iMajTruth == 0x4D )
            pLits[0] = Abc_LitNot(pLits[0]), iMajTruth = 0x8E, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0xD4 )
            pLits[0] = Abc_LitNot(pLits[0]), iMajTruth = 0xE8, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0x2B )
            pLits[1] = Abc_LitNot(pLits[1]), iMajTruth = 0x8E, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0xB2 )
            pLits[1] = Abc_LitNot(pLits[1]), iMajTruth = 0xE8, iXorTruth = 0xFF & ~iXorTruth;
        if ( iMajTruth == 0x8E )
            pLits[2] = Abc_LitNot(pLits[2]), iMajTruth = 0xE8, iXorTruth = 0xFF & ~iXorTruth;
        else if ( iMajTruth == 0x71 )
            pLits[2] = Abc_LitNot(pLits[2]), iMajTruth = 0x17, iXorTruth = 0xFF & ~iXorTruth;
        else assert( iMajTruth == 0xE8 || iMajTruth == 0x17 );
        // normalize carry-in
        if ( Abc_LitIsCompl(pLits[0]) )
        {
            for ( k = 0; k < 3; k++ )
                pLits[k] = Abc_LitNot(pLits[k]);
            iXorTruth = 0xFF & ~iXorTruth;
            iMajTruth = 0xFF & ~iMajTruth;
        }
        // add COs
        assert( !Abc_LitIsCompl(pLits[0]) );
        for ( k = 0; k < 3; k++ )
            Gia_ManAppendCo( pNew, pLits[k] );
        // create CI
        assert( iXorTruth == 0x96 || iXorTruth == 0x69 );
        pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+3) );
        pObj->Value = Abc_LitNotCond( Gia_ManAppendCi(pNew), (int)(iXorTruth == 0x69) );
        // create CI
        assert( iMajTruth == 0xE8 || iMajTruth == 0x17 );
        iCiLit = Abc_LitNotCond( Gia_ManAppendCi(pNew), (int)(iMajTruth == 0x17) );
    }   
    // assign carry out
    assert( iFadd == Vec_IntEntryLast(vChain) );
    pObj = Gia_ManObj( p, Vec_IntEntry(vFadds, 5*iFadd+4) );
    pObj->Value = iCiLit;
}